

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O1

int output_nyt(byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  adh_node_t *paVar2;
  
  paVar2 = get_nyt();
  iVar1 = output_bit_array(&paVar2->bit_array,output_buffer,output_file_ptr);
  return iVar1;
}

Assistant:

int output_nyt(byte_t *output_buffer, FILE *output_file_ptr) {
    // write NYT code
    adh_node_t* nyt = get_nyt();

#ifdef _DEBUG
    log_debug("  output_nyt", "%3s out_bit_idx=%-8d NYT=%s\n", "",
             out_bit_idx,
             fmt_bit_array(&nyt->bit_array));
#endif

    return output_bit_array(&(nyt->bit_array), output_buffer, output_file_ptr);
}